

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.h
# Opt level: O0

void __thiscall trun::TestResponseProxy::TestResponseProxy(TestResponseProxy *this)

{
  TestResponseProxy *this_local;
  
  this->_vptr_TestResponseProxy = (_func_int **)&PTR__TestResponseProxy_002d4dc0;
  Timer::Timer(&this->timer);
  trun::AssertError::AssertError(&this->assertError);
  this->exceptionThrown = false;
  std::__cxx11::string::string((string *)&this->exceptionString);
  this->testResult = kTestResult_Pass;
  this->assertCount = 0;
  this->errorCount = 0;
  std::__cxx11::string::string((string *)&this->symbolName);
  std::__cxx11::string::string((string *)&this->moduleName);
  this->pLogger = (ILogger *)0x0;
  return;
}

Assistant:

TestResponseProxy() = default;